

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# General.cc
# Opt level: O2

void __thiscall
General_blockedSignals_Test::~General_blockedSignals_Test(General_blockedSignals_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(General, blockedSignals)
{
  int calls = 0;
  const auto slot = [&calls] { calls++; };

  sigs::Signal<void()> s, s2;
  s2.connect(slot);
  s.connect(s2);

  s();
  ASSERT_EQ(calls, 1);

  // Block outer signal.
  s.setBlocked(true);
  ASSERT_TRUE(s.blocked());
  ASSERT_FALSE(s2.blocked());

  s();
  ASSERT_EQ(calls, 1);

  s.setBlocked(false);
  ASSERT_FALSE(s.blocked());

  s();
  ASSERT_EQ(calls, 2);

  // Block inner signal.
  s2.setBlocked(true);
  ASSERT_TRUE(s2.blocked());
  ASSERT_FALSE(s.blocked());

  s();
  ASSERT_EQ(calls, 2);
}